

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

void __thiscall
ON_V5ExtrusionDisplayMeshCache::ON_V5ExtrusionDisplayMeshCache(ON_V5ExtrusionDisplayMeshCache *this)

{
  ON_UUID OVar1;
  
  ON_UserData::ON_UserData(&this->super_ON_UserData);
  (this->super_ON_UserData).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0080bc30;
  (this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OVar1 = ON_ClassId::Uuid(&m_ON_V5ExtrusionDisplayMeshCache_class_rtti);
  (this->super_ON_UserData).m_userdata_uuid = OVar1;
  (this->super_ON_UserData).m_application_uuid.Data1 = 0xc8cda597;
  (this->super_ON_UserData).m_application_uuid.Data2 = 0xd957;
  (this->super_ON_UserData).m_application_uuid.Data3 = 0x4625;
  (this->super_ON_UserData).m_application_uuid.Data4[0] = 0xa4;
  (this->super_ON_UserData).m_application_uuid.Data4[1] = 0xb3;
  (this->super_ON_UserData).m_application_uuid.Data4[2] = 0xa0;
  (this->super_ON_UserData).m_application_uuid.Data4[3] = 0xb5;
  (this->super_ON_UserData).m_application_uuid.Data4[4] = '\x10';
  (this->super_ON_UserData).m_application_uuid.Data4[5] = 0xfc;
  (this->super_ON_UserData).m_application_uuid.Data4[6] = '0';
  (this->super_ON_UserData).m_application_uuid.Data4[7] = 0xd4;
  (this->super_ON_UserData).m_userdata_copycount = 1;
  return;
}

Assistant:

ON_V5ExtrusionDisplayMeshCache::ON_V5ExtrusionDisplayMeshCache()
  : ON_UserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V5ExtrusionDisplayMeshCache);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work.
  m_userdata_copycount = 1;
}